

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_write_all_data(znzFile fp,nifti_image *nim,nifti_brick_list *NBL)

{
  ulong numbytes;
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  
  if (NBL == (nifti_brick_list *)0x0) {
    if (nim->data == (void *)0x0) {
      fwrite("** NWAD: no image data to write\n",0x20,1,_stderr);
    }
    else {
      sVar1 = nifti_write_buffer(fp,nim->data,(long)nim->nbyper * nim->nvox);
      if ((long)nim->nbyper * nim->nvox <= sVar1) {
        if (1 < g_opts_0) {
          fprintf(_stderr,"+d wrote single image of %u bytes\n",sVar1 & 0xffffffff);
        }
        goto LAB_0010ead7;
      }
      fprintf(_stderr,"** ERROR: NWAD: wrote only %u of %u bytes to file\n",sVar1 & 0xffffffff);
    }
  }
  else {
    uVar2 = (ulong)(uint)NBL->nbricks;
    if (((NBL->bricks != (void **)0x0) && (0 < NBL->nbricks)) &&
       (numbytes = NBL->bsize, numbytes != 0)) {
      for (lVar3 = 0; lVar3 < (int)uVar2; lVar3 = lVar3 + 1) {
        sVar1 = nifti_write_buffer(fp,NBL->bricks[lVar3],numbytes);
        numbytes = NBL->bsize;
        if (sVar1 < numbytes) {
          fprintf(_stderr,"** NWAD ERROR: wrote %u of %u bytes of brick %d of %d to file",sVar1,
                  numbytes & 0xffffffff,(ulong)((int)lVar3 + 1),(ulong)(uint)NBL->nbricks);
          return -1;
        }
        uVar2 = (ulong)(uint)NBL->nbricks;
      }
      if (1 < g_opts_0) {
        fprintf(_stderr,"+d wrote image of %d brick(s), each of %u bytes\n",uVar2,
                numbytes & 0xffffffff);
      }
LAB_0010ead7:
      nim->byteorder = 1;
      return 0;
    }
    fprintf(_stderr,"** NWAD: no brick data to write (%p,%d,%u)\n",NBL->bricks,uVar2,
            (ulong)(uint)NBL->bsize);
  }
  return -1;
}

Assistant:

int nifti_write_all_data(znzFile fp, nifti_image * nim,
                         const nifti_brick_list * NBL)
{
   size_t ss;
   int    bnum;

   if( !NBL ){ /* just write one buffer and get out of here */
      if( nim->data == NULL ){
         fprintf(stderr,"** NWAD: no image data to write\n");
         return -1;
      }

      ss = nifti_write_buffer(fp,nim->data,nim->nbyper * nim->nvox);
      if (ss < nim->nbyper * nim->nvox){
         fprintf(stderr,
            "** ERROR: NWAD: wrote only %u of %u bytes to file\n",
            (unsigned)ss, (unsigned)(nim->nbyper * nim->nvox));
         return -1;
      }

      if( g_opts.debug > 1 )
         fprintf(stderr,"+d wrote single image of %u bytes\n", (unsigned)ss);
   } else {
      if( ! NBL->bricks || NBL->nbricks <= 0 || NBL->bsize <= 0 ){
         fprintf(stderr,"** NWAD: no brick data to write (%p,%d,%u)\n",
                 (void *)NBL->bricks, NBL->nbricks, (unsigned)NBL->bsize);
         return -1;
      }

      for( bnum = 0; bnum < NBL->nbricks; bnum++ ){
         ss = nifti_write_buffer(fp, NBL->bricks[bnum], NBL->bsize);
         if( ss < NBL->bsize ){
            fprintf(stderr,
              "** NWAD ERROR: wrote %u of %u bytes of brick %d of %d to file",
               (unsigned)ss, (unsigned)NBL->bsize, bnum+1, NBL->nbricks);
            return -1;
         }
      }
      if( g_opts.debug > 1 )
         fprintf(stderr,"+d wrote image of %d brick(s), each of %u bytes\n",
                 NBL->nbricks, (unsigned int)NBL->bsize);
   }

   /* mark as being in this CPU byte order */
   nim->byteorder = nifti_short_order() ;

   return 0;
}